

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ForkBranchBase::ForkBranchBase(ForkBranchBase *this,Own<kj::_::ForkHubBase> *hubParam)

{
  Own<kj::_::ForkHubBase> *other;
  ForkHubBase *pFVar1;
  Own<kj::_::ForkHubBase> *hubParam_local;
  ForkBranchBase *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_007d87d0;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  other = mv<kj::Own<kj::_::ForkHubBase>>(hubParam);
  Own<kj::_::ForkHubBase>::Own(&this->hub,other);
  this->next = (ForkBranchBase *)0x0;
  this->prevPtr = (ForkBranchBase **)0x0;
  pFVar1 = Own<kj::_::ForkHubBase>::operator->(&this->hub);
  if (pFVar1->tailBranch == (ForkBranchBase **)0x0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  else {
    pFVar1 = Own<kj::_::ForkHubBase>::operator->(&this->hub);
    this->prevPtr = pFVar1->tailBranch;
    *this->prevPtr = this;
    this->next = (ForkBranchBase *)0x0;
    pFVar1 = Own<kj::_::ForkHubBase>::operator->(&this->hub);
    pFVar1->tailBranch = &this->next;
  }
  return;
}

Assistant:

ForkBranchBase::ForkBranchBase(Own<ForkHubBase>&& hubParam): hub(kj::mv(hubParam)) {
  if (hub->tailBranch == nullptr) {
    onReadyEvent.arm();
  } else {
    // Insert into hub's linked list of branches.
    prevPtr = hub->tailBranch;
    *prevPtr = this;
    next = nullptr;
    hub->tailBranch = &next;
  }
}